

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

double __thiscall ON_HatchLine::AngleDegrees(ON_HatchLine *this)

{
  ON_HatchLine *local_20;
  double angle_degrees;
  ON_HatchLine *this_local;
  
  if ((this->m_angle_radians < 0.0) ||
     (6.283185307179586 < this->m_angle_radians || this->m_angle_radians == 6.283185307179586)) {
    this_local = (ON_HatchLine *)this->m_angle_radians;
  }
  else {
    local_20 = (ON_HatchLine *)(this->m_angle_radians * 57.29577951308232);
    if (360.0 <= (double)local_20) {
      local_20 = (ON_HatchLine *)0x0;
    }
    this_local = local_20;
  }
  return (double)this_local;
}

Assistant:

double ON_HatchLine::AngleDegrees() const
{
  if (0.0 <= m_angle_radians && m_angle_radians < 2.0*ON_PI)
  {
    double angle_degrees = m_angle_radians*(180.0/ON_PI);
    if (angle_degrees >= 360.0)
      angle_degrees = 0.0;
    return angle_degrees;
  }
  return m_angle_radians; // UNSET VALUE OR NaN
}